

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPSymmetricAlgorithm::decryptUpdate
          (OSSLEVPSymmetricAlgorithm *this,ByteString *encryptedData,ByteString *data)

{
  BIGNUM *a;
  EVP_CIPHER_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ByteString *this_00;
  uchar *out;
  uchar *in;
  ulong e;
  char *pcVar4;
  long *in_RDI;
  ByteString dummy;
  int outLen;
  ByteString *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar5;
  SymmetricAlgorithm *in_stack_ffffffffffffff58;
  SymmetricAlgorithm *this_01;
  uint local_24;
  byte local_1;
  
  bVar1 = SymmetricAlgorithm::decryptUpdate
                    (in_stack_ffffffffffffff58,
                     (ByteString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
  if (bVar1) {
    if ((int)in_RDI[2] == 5) {
      ByteString::resize((ByteString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                         ,(size_t)in_stack_ffffffffffffff48);
      local_1 = 1;
    }
    else {
      if (in_RDI[0xd] != 0) {
        a = (BIGNUM *)in_RDI[0xe];
        sVar3 = ByteString::size((ByteString *)0x133fdc);
        BN_add_word(a,sVar3);
      }
      ByteString::size((ByteString *)0x134003);
      (**(code **)(*in_RDI + 0x68))();
      ByteString::resize((ByteString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                         ,(size_t)in_stack_ffffffffffffff48);
      sVar3 = ByteString::size((ByteString *)0x134032);
      local_24 = (uint)sVar3;
      sVar3 = ByteString::size((ByteString *)0x134046);
      this_00 = (ByteString *)ByteString::size((ByteString *)0x134058);
      softHSMLog(7,"decryptUpdate",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x1b4,"Decrypting %d bytes into buffer of %d bytes",sVar3);
      ctx = (EVP_CIPHER_CTX *)in_RDI[0xc];
      out = ByteString::operator[]
                      ((ByteString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (size_t)this_00);
      in = ByteString::const_byte_str(this_00);
      sVar3 = ByteString::size((ByteString *)0x1340ca);
      iVar2 = EVP_DecryptUpdate(ctx,out,(int *)&stack0xffffffffffffffdc,in,(int)sVar3);
      if (iVar2 == 0) {
        e = ERR_get_error();
        uVar5 = 0;
        pcVar4 = ERR_error_string(e,(char *)0x0);
        softHSMLog(3,"decryptUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0x1b8,"EVP_DecryptUpdate failed: %s",pcVar4);
        clean((OSSLEVPSymmetricAlgorithm *)CONCAT44(uVar5,in_stack_ffffffffffffff50));
        this_01 = (SymmetricAlgorithm *)&stack0xffffffffffffffb0;
        ByteString::ByteString((ByteString *)0x13414b);
        SymmetricAlgorithm::decryptFinal
                  (this_01,(ByteString *)CONCAT44(uVar5,in_stack_ffffffffffffff50));
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x13416e);
      }
      else {
        softHSMLog(7,"decryptUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0x1c2,"Decrypt returned %d bytes of data",(ulong)local_24);
        ByteString::resize((ByteString *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (size_t)this_00);
        in_RDI[6] = in_RDI[6] - (long)(int)local_24;
        local_1 = 1;
      }
    }
  }
  else {
    clean((OSSLEVPSymmetricAlgorithm *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
         );
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::decryptUpdate(const ByteString& encryptedData, ByteString& data)
{
	if (!SymmetricAlgorithm::decryptUpdate(encryptedData, data))
	{
		clean();
		return false;
	}

	// AEAD ciphers should not return decrypted data until final is called
	if (currentCipherMode == SymMode::GCM)
	{
		data.resize(0);
		return true;
	}

	// Count number of bytes written
	if (maximumBytes)
	{
		BN_add_word(counterBytes, encryptedData.size());
	}

	// Prepare the output block
	data.resize(encryptedData.size() + getBlockSize());

	int outLen = data.size();

	DEBUG_MSG("Decrypting %d bytes into buffer of %d bytes", encryptedData.size(), data.size());

	if (!EVP_DecryptUpdate(pCurCTX, &data[0], &outLen, (unsigned char*) encryptedData.const_byte_str(), encryptedData.size()))
	{
		ERROR_MSG("EVP_DecryptUpdate failed: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	DEBUG_MSG("Decrypt returned %d bytes of data", outLen);

	// Resize the output block
	data.resize(outLen);
	currentBufferSize -= outLen;

	return true;
}